

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

void __thiscall Packet::Packet(Packet *this,char *data,socket *socket,shared_ptr<KeyValueStore> *k)

{
  uint uVar1;
  KeyValueStore *this_00;
  pair<bool,_const_FlaggedValue_&> pVar2;
  string msg;
  FlaggedValue local_60;
  vector<char,_std::allocator<char>_> val;
  
  (this->val).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->val).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->key).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->val).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->key).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->key).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar1 = *(uint *)(data + 8);
  this->bod_len = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = *(uint *)(data + 0xc);
  this->opaque = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  this->key_len = *(ushort *)(data + 2) << 8 | *(ushort *)(data + 2) >> 8;
  this->op = data[1];
  this->ext_len = (int)data[4];
  read(this,(int)socket,socket,(size_t)k);
  if (data[1] == '\x01') {
    this_00 = (k->super___shared_ptr<KeyValueStore,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&msg,&this->val);
    msg.field_2._8_4_ = this->flags;
    KeyValueStore::set(this_00,&this->key,(FlaggedValue *)&msg);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&msg);
    respondToSet(this,socket);
  }
  else if (data[1] == '\0') {
    pVar2 = KeyValueStore::get((k->super___shared_ptr<KeyValueStore,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr,&this->key);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::string::string((string *)&msg,"Key not found",(allocator *)&local_60);
      std::vector<char,std::allocator<char>>::
      vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((vector<char,std::allocator<char>> *)&val,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )msg._M_dataplus._M_p,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(msg._M_dataplus._M_p + msg._M_string_length),(allocator_type *)&local_60);
      std::vector<char,_std::allocator<char>_>::vector(&local_60.value,&val);
      local_60.flags = 0;
      respondToGet(this,socket,&local_60,false);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&local_60);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&val.super__Vector_base<char,_std::allocator<char>_>);
      std::__cxx11::string::~string((string *)&msg);
    }
    else {
      respondToGet(this,socket,pVar2.second,true);
    }
  }
  return;
}

Assistant:

Packet::Packet(char data[24], socket& socket,
               const std::shared_ptr<KeyValueStore>& k)
    : bod_len(readUInt32LE(data, 8)),
      opaque(readUInt32LE(data, 12)),
      key_len(readUInt16LE(data, 2)),
      op(data[1]),
      ext_len(data[4]) {

  read(socket);
  if (data[1] == static_cast<char>(OpCode::GET)) {
    std::pair<bool, const FlaggedValue&> value{ k->get(key) };
    if (value.first) {
      respondToGet(socket, value.second, true);
    } else {
      std::string msg = "Key not found";
      std::vector<char> val(msg.cbegin(), msg.cend());
      respondToGet(socket, FlaggedValue{ val, 0 }, false);
    }
  } else if (data[1] == static_cast<char>(OpCode::SET)) {
    k->set(key, FlaggedValue{ val, flags });
    respondToSet(socket);
  }
}